

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aead_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_18ac8a::PerAEADTest_TestExtraInput_Test::TestBody
          (PerAEADTest_TestExtraInput_Test *this)

{
  ParamType *pPVar1;
  EVP_AEAD *pEVar2;
  PerAEADTest_TestExtraInput_Test *this_00;
  string test_vectors;
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  this_00 = this;
  pPVar1 = testing::WithParamInterface<(anonymous_namespace)::KnownAEAD>::GetParam();
  pEVar2 = PerAEADTest::aead(&this_00->super_PerAEADTest);
  if (pEVar2->seal_scatter_supports_extra_in != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,pPVar1->test_vectors,&local_71);
    std::operator+(&local_50,"crypto/cipher/test/",&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    local_18 = std::
               _Function_handler<void_(FileTest_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc:286:39)>
               ::_M_invoke;
    local_20 = std::
               _Function_handler<void_(FileTest_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/aead_test.cc:286:39)>
               ::_M_manager;
    local_30._M_unused._0_8_ = (undefined8)pPVar1;
    local_30._8_8_ = this;
    FileTestGTest(local_50._M_dataplus._M_p,(function<void_(FileTest_*)> *)&local_30);
    std::_Function_base::~_Function_base((_Function_base *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

TEST_P(PerAEADTest, TestExtraInput) {
  const KnownAEAD &aead_config = GetParam();
  if (!aead()->seal_scatter_supports_extra_in) {
    return;
  }

  const std::string test_vectors =
      "crypto/cipher/test/" + std::string(aead_config.test_vectors);
  FileTestGTest(test_vectors.c_str(), [&](FileTest *t) {
    if (t->HasAttribute("NO_SEAL") ||  //
        t->HasAttribute("FAILS") ||    //
        (aead_config.flags & kNondeterministic)) {
      t->SkipCurrent();
      return;
    }

    std::vector<uint8_t> key, nonce, in, ad, ct, tag;
    ASSERT_TRUE(t->GetBytes(&key, "KEY"));
    ASSERT_TRUE(t->GetBytes(&nonce, "NONCE"));
    ASSERT_TRUE(t->GetBytes(&in, "IN"));
    ASSERT_TRUE(t->GetBytes(&ad, "AD"));
    ASSERT_TRUE(t->GetBytes(&ct, "CT"));
    ASSERT_TRUE(t->GetBytes(&tag, "TAG"));

    bssl::ScopedEVP_AEAD_CTX ctx;
    ASSERT_TRUE(EVP_AEAD_CTX_init(ctx.get(), aead(), key.data(), key.size(),
                                  tag.size(), nullptr));
    std::vector<uint8_t> out_tag(EVP_AEAD_max_overhead(aead()) + in.size());
    std::vector<uint8_t> out(in.size());

    for (size_t extra_in_size = 0; extra_in_size < in.size(); extra_in_size++) {
      size_t tag_bytes_written;
      SCOPED_TRACE(extra_in_size);
      ASSERT_TRUE(EVP_AEAD_CTX_seal_scatter(
          ctx.get(), out.data(), out_tag.data(), &tag_bytes_written,
          out_tag.size(), nonce.data(), nonce.size(), in.data(),
          in.size() - extra_in_size, in.data() + in.size() - extra_in_size,
          extra_in_size, ad.data(), ad.size()));

      ASSERT_EQ(tag_bytes_written, extra_in_size + tag.size());

      memcpy(out.data() + in.size() - extra_in_size, out_tag.data(),
             extra_in_size);

      EXPECT_EQ(Bytes(ct), Bytes(out.data(), in.size()));
      EXPECT_EQ(Bytes(tag), Bytes(out_tag.data() + extra_in_size,
                                  tag_bytes_written - extra_in_size));
    }
  });
}